

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

bool __thiscall IDLExport::save(IDLExport *this,ostream *stream,RegistryIterator *type)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  size_type sVar4;
  iterator iVar5;
  size_t sVar6;
  long lVar7;
  Type *pTVar8;
  ostream *poVar9;
  mapped_type *this_00;
  UnsupportedType *this_01;
  string base_name;
  string def;
  string type_namespace;
  string local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  string local_2c0;
  string local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  string local_240;
  ostringstream stream_1;
  ostringstream local_210 [376];
  _Alloc_hider local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Typelib::Type_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Typelib::Type_*>_>_>
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->m_selected_types)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    Typelib::Type::getName_abi_cxx11_();
    sVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&this->m_selected_types,(key_type *)&stream_1);
    std::__cxx11::string::~string((string *)&stream_1);
    if (sVar4 == 0) {
      return false;
    }
  }
  bVar1 = Typelib::RegistryIterator::isAlias(type);
  if (!bVar1) {
    if ((this->m_blob_threshold != 0) &&
       (iVar3 = Typelib::Type::getSize(), this->m_blob_threshold < iVar3)) {
      Typelib::RegistryIterator::getNamespace_abi_cxx11_(&type_namespace,type);
      anon_unknown.dwarf_1aacf::getIDLAbsoluteNamespace((string *)&stream_1,&type_namespace,this);
      std::__cxx11::string::~string((string *)&type_namespace);
      sVar6 = anon_unknown.dwarf_1aacf::namespaceIndentLevel((string *)&stream_1);
      type_namespace._M_dataplus._M_p = (pointer)&type_namespace.field_2;
      std::__cxx11::string::_M_construct((ulong)&type_namespace,(char)(sVar6 << 2));
      adaptNamespace(this,stream,(string *)&stream_1);
      poVar9 = std::operator<<(stream,(string *)&type_namespace);
      poVar9 = std::operator<<(poVar9,"typedef sequence<octet> ");
      Typelib::Type::getBasename_abi_cxx11_();
      poVar9 = std::operator<<(poVar9,(string *)&base_name);
      std::operator<<(poVar9,";\n");
      std::__cxx11::string::~string((string *)&base_name);
      std::__cxx11::string::~string((string *)&type_namespace);
      std::__cxx11::string::~string((string *)&stream_1);
      return true;
    }
    _stream_1 = &PTR_visit__001258a8;
    std::__cxx11::ostringstream::ostringstream(local_210);
    local_98._M_p = (pointer)&local_88;
    local_90 = 0;
    local_88._M_local_buf[0] = '\0';
    local_78._M_p = (pointer)&local_68;
    local_70 = 0;
    local_68._M_local_buf[0] = '\0';
    local_58 = &this->m_exported_typedefs;
    Typelib::Type::getNamespace_abi_cxx11_();
    anon_unknown.dwarf_1aacf::getIDLAbsoluteNamespace(&type_namespace,&base_name,this);
    anon_unknown.dwarf_1aacf::IDLExportVisitor::setTargetNamespace
              ((IDLExportVisitor *)&stream_1,&type_namespace);
    std::__cxx11::string::~string((string *)&type_namespace);
    std::__cxx11::string::~string((string *)&base_name);
    Typelib::TypeVisitor::apply((Type *)&stream_1);
    std::__cxx11::stringbuf::str();
    if (type_namespace._M_string_length != 0) {
      std::__cxx11::string::string((string *)&base_name,(string *)&local_78);
      adaptNamespace(this,stream,&base_name);
      std::__cxx11::string::~string((string *)&base_name);
      std::operator<<(stream,(string *)&type_namespace);
    }
    std::__cxx11::string::~string((string *)&type_namespace);
    anon_unknown.dwarf_1aacf::IDLExportVisitor::~IDLExportVisitor((IDLExportVisitor *)&stream_1);
    return type_namespace._M_string_length != 0;
  }
  Typelib::Type::getNamespace_abi_cxx11_();
  Typelib::RegistryIterator::getNamespace_abi_cxx11_(&type_namespace,type);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &stream_1,&type_namespace);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&type_namespace);
    std::__cxx11::string::~string((string *)&stream_1);
  }
  else {
    Typelib::Type::getBasename_abi_cxx11_();
    Typelib::RegistryIterator::getBasename_abi_cxx11_(&local_340,type);
    std::operator+(&def,"struct ",&local_340);
    bVar1 = std::operator!=(&base_name,&def);
    if (!bVar1) {
      std::__cxx11::string::~string((string *)&def);
      std::__cxx11::string::~string((string *)&local_340);
      std::__cxx11::string::~string((string *)&base_name);
      std::__cxx11::string::~string((string *)&type_namespace);
      std::__cxx11::string::~string((string *)&stream_1);
      return false;
    }
    Typelib::Type::getBasename_abi_cxx11_();
    Typelib::RegistryIterator::getBasename_abi_cxx11_(&local_2a0,type);
    std::operator+(&local_280,"enum ",&local_2a0);
    bVar1 = std::operator!=(&local_260,&local_280);
    if (bVar1) {
      Typelib::RegistryIterator::getBasename_abi_cxx11_(&local_2c0,type);
      Typelib::Type::getBasename_abi_cxx11_();
      std::operator+(&local_2e0,"struct ",&local_300);
      bVar1 = std::operator!=(&local_2c0,&local_2e0);
      if (bVar1) {
        Typelib::RegistryIterator::getBasename_abi_cxx11_(&local_240,type);
        Typelib::Type::getBasename_abi_cxx11_();
        std::operator+(&local_50,"enum ",&local_320);
        bVar1 = std::operator!=(&local_240,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_320);
        std::__cxx11::string::~string((string *)&local_240);
      }
      else {
        bVar1 = false;
      }
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_300);
      std::__cxx11::string::~string((string *)&local_2c0);
    }
    else {
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&def);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&base_name);
    std::__cxx11::string::~string((string *)&type_namespace);
    std::__cxx11::string::~string((string *)&stream_1);
    if (bVar1 == false) {
      return false;
    }
  }
  checkType(*(Type **)(*(long *)(type + 8) + 0x40));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stream_1);
  Typelib::RegistryIterator::getNamespace_abi_cxx11_(&base_name,type);
  anon_unknown.dwarf_1aacf::getIDLAbsoluteNamespace(&type_namespace,&base_name,this);
  std::__cxx11::string::~string((string *)&base_name);
  Typelib::RegistryIterator::getName_abi_cxx11_(&base_name,type);
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Typelib::Type_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Typelib::Type_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Typelib::Type_*>_>_>
          ::find(&(this->m_exported_typedefs)._M_t,&base_name);
  std::__cxx11::string::~string((string *)&base_name);
  if ((_Rb_tree_header *)iVar5._M_node !=
      &(this->m_exported_typedefs)._M_t._M_impl.super__Rb_tree_header) {
    cVar2 = Typelib::Type::operator!=
                      (*(Type **)(iVar5._M_node + 2),*(Type **)(*(long *)(type + 8) + 0x40));
    if (cVar2 != '\0') {
      this_01 = (UnsupportedType *)__cxa_allocate_exception(0x38);
      pTVar8 = *(Type **)(*(long *)(type + 8) + 0x40);
      Typelib::RegistryIterator::getName_abi_cxx11_(&local_340,type);
      std::operator+(&def,"the typedef name ",&local_340);
      std::operator+(&base_name,&def," is reserved by the IDL exporter");
      Typelib::UnsupportedType::UnsupportedType(this_01,pTVar8,&base_name);
      __cxa_throw(this_01,&Typelib::UnsupportedType::typeinfo,
                  Typelib::UnsupportedType::~UnsupportedType);
    }
    bVar1 = false;
    goto LAB_00115f25;
  }
  Typelib::RegistryIterator::getBasename_abi_cxx11_(&base_name,type);
  bVar1 = false;
  lVar7 = std::__cxx11::string::find_first_of((char *)&base_name,0x11e17e);
  std::__cxx11::string::~string((string *)&base_name);
  if (lVar7 != -1) goto LAB_00115f25;
  Typelib::RegistryIterator::getBasename_abi_cxx11_(&def,type);
  anon_unknown.dwarf_1aacf::stripLeadingUnderscore(&base_name,&def);
  std::__cxx11::string::~string((string *)&def);
  iVar3 = Typelib::Type::getCategory();
  if (iVar3 == 1) {
    lVar7 = __dynamic_cast(*(undefined8 *)(*(long *)(type + 8) + 0x40),&Typelib::Type::typeinfo,
                           &Typelib::Array::typeinfo,0);
    if (lVar7 == 0) {
      __cxa_bad_cast();
    }
    pTVar8 = (Type *)Typelib::Indirect::getIndirection();
    getIDLAbsolute_abi_cxx11_(&def,this,pTVar8);
    poVar9 = std::operator<<((ostream *)&stream_1,(string *)&def);
    poVar9 = std::operator<<(poVar9," ");
    poVar9 = std::operator<<(poVar9,(string *)&base_name);
    poVar9 = std::operator<<(poVar9,"[");
    Typelib::Array::getDimension();
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::operator<<(poVar9,"];");
LAB_00115ec9:
    std::__cxx11::string::~string((string *)&def);
  }
  else {
    iVar3 = Typelib::Type::getCategory();
    if (iVar3 == 7) {
      Typelib::Type::getName_abi_cxx11_();
      bVar1 = std::operator!=(&def,"/std/string");
      std::__cxx11::string::~string((string *)&def);
      if (bVar1) {
        lVar7 = __dynamic_cast(*(undefined8 *)(*(long *)(type + 8) + 0x40),&Typelib::Type::typeinfo,
                               &Typelib::Container::typeinfo,0);
        if (lVar7 == 0) {
          __cxa_bad_cast();
        }
        poVar9 = std::operator<<((ostream *)&stream_1,"sequence<");
        pTVar8 = (Type *)Typelib::Indirect::getIndirection();
        getIDLAbsolute_abi_cxx11_(&def,this,pTVar8);
        poVar9 = std::operator<<(poVar9,(string *)&def);
        poVar9 = std::operator<<(poVar9,"> ");
        poVar9 = std::operator<<(poVar9,(string *)&base_name);
        std::operator<<(poVar9,";");
        goto LAB_00115ec9;
      }
    }
    iVar3 = Typelib::Type::getCategory();
    if (iVar3 == 6) {
      if (this->m_opaque_as_any == true) {
        poVar9 = std::operator<<((ostream *)&stream_1,"any ");
        poVar9 = std::operator<<(poVar9,(string *)&base_name);
        std::operator<<(poVar9,";");
      }
    }
    else {
      Typelib::RegistryIterator::getBasename_abi_cxx11_(&def,type);
      lVar7 = std::__cxx11::string::find_first_of((char *)&def,0x11e0ea);
      std::__cxx11::string::~string((string *)&def);
      if (lVar7 == -1) {
        getIDLAbsolute_abi_cxx11_(&def,this,*(Type **)(*(long *)(type + 8) + 0x40));
        poVar9 = std::operator<<((ostream *)&stream_1,(string *)&def);
        poVar9 = std::operator<<(poVar9," ");
        poVar9 = std::operator<<(poVar9,(string *)&base_name);
        std::operator<<(poVar9,";");
        goto LAB_00115ec9;
      }
    }
  }
  std::__cxx11::stringbuf::str();
  if (def._M_string_length != 0) {
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ::operator[](&this->m_typedefs,&type_namespace);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this_00,&def);
  }
  std::__cxx11::string::~string((string *)&def);
  std::__cxx11::string::~string((string *)&base_name);
  bVar1 = true;
LAB_00115f25:
  std::__cxx11::string::~string((string *)&type_namespace);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stream_1);
  return bVar1;
}

Assistant:

bool IDLExport::save
    ( ostream& stream
    , Typelib::RegistryIterator const& type )
{
    if (! m_selected_types.empty())
    {
        if (m_selected_types.count(type->getName()) == 0)
        {
            return false;
        }
    }

    if (type.isAlias())
    {
        // IDL has C++-like rules for struct and enums. Do not alias a "struct A" to "A";
        if (type->getNamespace() != type.getNamespace()
                || (type->getBasename() != "struct " + type.getBasename()
                    && type->getBasename() != "enum " + type.getBasename()
                    && type.getBasename() != "struct " + type->getBasename()
                    && type.getBasename() != "enum " + type->getBasename()))
        {
            IDLExport::checkType(*type);
            ostringstream stream;

            std::string type_namespace = getIDLAbsoluteNamespace(type.getNamespace(), *this);

            map<string, Type const*>::const_iterator already_exported =
                m_exported_typedefs.find(type.getName());
            if (already_exported != m_exported_typedefs.end())
            {
                if (*already_exported->second != *type)
                    throw UnsupportedType(*type, "the typedef name " + type.getName() + " is reserved by the IDL exporter");
                return false;
            }
            else if (type.getBasename().find_first_of("/<>") != std::string::npos)
            {
                return false;
            }

            std::string base_name = stripLeadingUnderscore(type.getBasename());

            // Alias types using typedef, taking into account that the aliased type
            // may not be in the same module than the new alias.
            if (type->getCategory() == Type::Array)
            {
                Array const& array_t = dynamic_cast<Array const&>(*type);
                stream
                    << getIDLAbsolute(array_t.getIndirection())
                    << " " << base_name << "[" << array_t.getDimension() << "];";
            }
            else if (type->getCategory() == Type::Container && type->getName() != "/std/string")
            {
                // Generate a sequence, regardless of the actual container type
                Container const& container_t = dynamic_cast<Container const&>(*type);
                stream << "sequence<" << getIDLAbsolute(container_t.getIndirection()) << "> " << base_name << ";";
            }
            else if (type->getCategory() == Type::Opaque)
            {
                if (marshalOpaquesAsAny())
                    stream << "any " << base_name << ";";
            }
            else if (type.getBasename().find_first_of(" ") == string::npos)
                stream << getIDLAbsolute(*type) << " " << base_name << ";";

            std::string def = stream.str();
            if (!def.empty())
                m_typedefs[type_namespace].push_back(def);
            return true;
        }
        else return false;
    }
    else
    {
        // Don't call adaptNamespace right now, since some types can be simply
        // ignored by the IDLExportVisitor -- resulting in an empty module,
        // which is not accepted in IDL
        //
        // Instead, act "as if" the namespace was changed, capturing the output
        // in a temporary ostringstream and change namespace only if some output
        // has actually been generated

        if (m_blob_threshold && static_cast<int>(type->getSize()) > m_blob_threshold)
        {
            string target_namespace = getIDLAbsoluteNamespace(type.getNamespace(), *this);
            size_t ns_size = namespaceIndentLevel(target_namespace);
            string indent_string = string(ns_size * 4, ' ');

            adaptNamespace(stream, target_namespace);
            stream << indent_string << "typedef sequence<octet> " << type->getBasename() << ";\n";
            return true;
        }
        else
        {
            IDLExportVisitor exporter(type.getRegistry(), *this, m_exported_typedefs);
            exporter.apply(*type);

            string result = exporter.getResult();
            if (result.empty())
                return false;
            else
            {
                adaptNamespace(stream, exporter.getTargetNamespace());
                stream << result;
                return true;
            }
        }
    }
}